

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

int Fra_ClausRunBmc(Clu_Man_t *p)

{
  int iVar1;
  lit lVar2;
  int iVar3;
  int local_34;
  int i;
  int RetValue;
  int nLitsTot;
  int Lits [2];
  Aig_Obj_t *pObj;
  Clu_Man_t *p_local;
  
  iVar1 = p->pCnf->nVars;
  Lits = (int  [2])Aig_ManCo(p->pAig,0);
  local_34 = 0;
  while( true ) {
    if (p->nPref + p->nFrames <= local_34) {
      return 1;
    }
    lVar2 = toLitCond(p->pCnf->pVarNums[*(int *)((long)Lits + 0x24)],0);
    RetValue = local_34 * iVar1 * 2 + lVar2;
    iVar3 = sat_solver_solve(p->pSatBmc,&RetValue,&nLitsTot,(long)p->nBTLimit,0,0,0);
    if (iVar3 != -1) break;
    local_34 = local_34 + 1;
  }
  return 0;
}

Assistant:

int Fra_ClausRunBmc( Clu_Man_t * p )
{
    Aig_Obj_t * pObj;
    int Lits[2], nLitsTot, RetValue, i;
    // set the output literals
    nLitsTot = 2 * p->pCnf->nVars;
    pObj = Aig_ManCo(p->pAig, 0);
    for ( i = 0; i < p->nPref + p->nFrames; i++ )
    {
        Lits[0] = i * nLitsTot + toLitCond( p->pCnf->pVarNums[pObj->Id], 0 ); 
        RetValue = sat_solver_solve( p->pSatBmc, Lits, Lits + 1, (ABC_INT64_T)p->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( RetValue != l_False )
            return 0;
    }
    return 1;
}